

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Settings::IntParam::IntParam(IntParam *this)

{
  string *in_RDI;
  string *local_40;
  string *local_20;
  
  local_20 = in_RDI;
  do {
    std::__cxx11::string::string(local_20);
    local_20 = local_20 + 0x20;
  } while (local_20 != in_RDI + 0x380);
  local_40 = in_RDI + 0x380;
  do {
    std::__cxx11::string::string(local_40);
    local_40 = local_40 + 0x20;
  } while (local_40 != in_RDI + 0x700);
  std::__cxx11::string::operator=(in_RDI,"objsense");
  std::__cxx11::string::operator=(in_RDI + 0x380,"objective sense (-1 - minimize, +1 - maximize)");
  *(undefined4 *)(in_RDI + 0x770) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x7e0) = 1;
  *(undefined4 *)(in_RDI + 0x700) = 1;
  std::__cxx11::string::operator=(in_RDI + 0x20,"representation");
  std::__cxx11::string::operator=
            (in_RDI + 0x3a0,
             "type of computational form (0 - auto, 1 - column representation, 2 - row representation)"
            );
  *(undefined4 *)(in_RDI + 0x774) = 0;
  *(undefined4 *)(in_RDI + 0x7e4) = 2;
  *(undefined4 *)(in_RDI + 0x704) = 0;
  std::__cxx11::string::operator=(in_RDI + 0x40,"algorithm");
  std::__cxx11::string::operator=(in_RDI + 0x3c0,"type of algorithm (0 - primal, 1 - dual)");
  *(undefined4 *)(in_RDI + 0x778) = 0;
  *(undefined4 *)(in_RDI + 0x7e8) = 1;
  *(undefined4 *)(in_RDI + 0x708) = 1;
  std::__cxx11::string::operator=(in_RDI + 0x60,"factor_update_type");
  std::__cxx11::string::operator=
            (in_RDI + 0x3e0,"type of LU update (0 - eta update, 1 - Forrest-Tomlin update)");
  *(undefined4 *)(in_RDI + 0x77c) = 0;
  *(undefined4 *)(in_RDI + 0x7ec) = 1;
  *(undefined4 *)(in_RDI + 0x70c) = 1;
  std::__cxx11::string::operator=(in_RDI + 0x80,"factor_update_max");
  std::__cxx11::string::operator=
            (in_RDI + 0x400,"maximum number of LU updates without fresh factorization (0 - auto)");
  *(undefined4 *)(in_RDI + 0x780) = 0;
  *(undefined4 *)(in_RDI + 0x7f0) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x710) = 0;
  std::__cxx11::string::operator=(in_RDI + 0xa0,"iterlimit");
  std::__cxx11::string::operator=(in_RDI + 0x420,"iteration limit (-1 - no limit)");
  *(undefined4 *)(in_RDI + 0x784) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x7f4) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x714) = 0xffffffff;
  std::__cxx11::string::operator=(in_RDI + 0xc0,"reflimit");
  std::__cxx11::string::operator=(in_RDI + 0x440,"refinement limit (-1 - no limit)");
  *(undefined4 *)(in_RDI + 0x788) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x7f8) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x718) = 0xffffffff;
  std::__cxx11::string::operator=(in_RDI + 0xe0,"stallreflimit");
  std::__cxx11::string::operator=(in_RDI + 0x460,"stalling refinement limit (-1 - no limit)");
  *(undefined4 *)(in_RDI + 0x78c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x7fc) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x71c) = 0xffffffff;
  std::__cxx11::string::operator=(in_RDI + 0x100,"displayfreq");
  std::__cxx11::string::operator=(in_RDI + 0x480,"display frequency");
  *(undefined4 *)(in_RDI + 0x790) = 1;
  *(undefined4 *)(in_RDI + 0x800) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x720) = 200;
  std::__cxx11::string::operator=(in_RDI + 0x120,"verbosity");
  std::__cxx11::string::operator=
            (in_RDI + 0x4a0,
             "verbosity level (0 - error, 1 - warning, 2 - debug, 3 - normal, 4 - high, 5 - full)");
  *(undefined4 *)(in_RDI + 0x794) = 0;
  *(undefined4 *)(in_RDI + 0x804) = 5;
  *(undefined4 *)(in_RDI + 0x724) = 3;
  std::__cxx11::string::operator=(in_RDI + 0x140,"simplifier");
  std::__cxx11::string::operator=
            (in_RDI + 0x4c0,"simplifier (0 - off, 1 - auto, 2 - PaPILO, 3 - internal)");
  *(undefined4 *)(in_RDI + 0x798) = 0;
  *(undefined4 *)(in_RDI + 0x808) = 3;
  *(undefined4 *)(in_RDI + 0x728) = 3;
  std::__cxx11::string::operator=(in_RDI + 0x160,"scaler");
  std::__cxx11::string::operator=
            (in_RDI + 0x4e0,
             "scaling (0 - off, 1 - uni-equilibrium, 2 - bi-equilibrium, 3 - geometric, 4 - iterated geometric, 5 - least squares, 6 - geometric-equilibrium)"
            );
  *(undefined4 *)(in_RDI + 0x79c) = 0;
  *(undefined4 *)(in_RDI + 0x80c) = 6;
  *(undefined4 *)(in_RDI + 0x72c) = 2;
  std::__cxx11::string::operator=(in_RDI + 0x180,"starter");
  std::__cxx11::string::operator=
            (in_RDI + 0x500,
             "crash basis generated when starting from scratch (0 - none, 1 - weight, 2 - sum, 3 - vector)"
            );
  *(undefined4 *)(in_RDI + 0x7a0) = 0;
  *(undefined4 *)(in_RDI + 0x810) = 3;
  *(undefined4 *)(in_RDI + 0x730) = 0;
  std::__cxx11::string::operator=(in_RDI + 0x1a0,"pricer");
  std::__cxx11::string::operator=
            (in_RDI + 0x520,
             "pricing method (0 - auto, 1 - dantzig, 2 - parmult, 3 - devex, 4 - quicksteep, 5 - steep)"
            );
  *(undefined4 *)(in_RDI + 0x7a4) = 0;
  *(undefined4 *)(in_RDI + 0x814) = 5;
  *(undefined4 *)(in_RDI + 0x734) = 0;
  std::__cxx11::string::operator=(in_RDI + 0x1c0,"ratiotester");
  std::__cxx11::string::operator=
            (in_RDI + 0x540,
             "method for ratio test (0 - textbook, 1 - harris, 2 - fast, 3 - boundflipping)");
  *(undefined4 *)(in_RDI + 0x7a8) = 0;
  *(undefined4 *)(in_RDI + 0x818) = 3;
  *(undefined4 *)(in_RDI + 0x738) = 3;
  std::__cxx11::string::operator=(in_RDI + 0x1e0,"syncmode");
  std::__cxx11::string::operator=
            (in_RDI + 0x560,
             "mode for synchronizing real and rational LP (0 - store only real LP, 1 - auto, 2 - manual)"
            );
  *(undefined4 *)(in_RDI + 0x7ac) = 0;
  *(undefined4 *)(in_RDI + 0x81c) = 2;
  *(undefined4 *)(in_RDI + 0x73c) = 0;
  std::__cxx11::string::operator=(in_RDI + 0x200,"readmode");
  std::__cxx11::string::operator=
            (in_RDI + 0x580,"mode for reading LP files (0 - floating-point, 1 - rational)");
  *(undefined4 *)(in_RDI + 0x7b0) = 0;
  *(undefined4 *)(in_RDI + 0x820) = 1;
  *(undefined4 *)(in_RDI + 0x740) = 0;
  std::__cxx11::string::operator=(in_RDI + 0x220,"solvemode");
  std::__cxx11::string::operator=
            (in_RDI + 0x5a0,
             "mode for iterative refinement strategy (0 - floating-point solve, 1 - auto, 2 - exact rational solve)"
            );
  *(undefined4 *)(in_RDI + 0x7b4) = 0;
  *(undefined4 *)(in_RDI + 0x824) = 2;
  *(undefined4 *)(in_RDI + 0x744) = 1;
  std::__cxx11::string::operator=(in_RDI + 0x240,"checkmode");
  std::__cxx11::string::operator=
            (in_RDI + 0x5c0,
             "mode for a posteriori feasibility checks (0 - floating-point check, 1 - auto, 2 - exact rational check)"
            );
  *(undefined4 *)(in_RDI + 0x7b8) = 0;
  *(undefined4 *)(in_RDI + 0x828) = 2;
  *(undefined4 *)(in_RDI + 0x748) = 1;
  std::__cxx11::string::operator=(in_RDI + 0x260,"timer");
  std::__cxx11::string::operator=
            (in_RDI + 0x5e0,
             "type of timer (1 - cputime, aka. usertime, 2 - wallclock time, 0 - no timing)");
  *(undefined4 *)(in_RDI + 0x7bc) = 0;
  *(undefined4 *)(in_RDI + 0x82c) = 2;
  *(undefined4 *)(in_RDI + 0x74c) = 1;
  std::__cxx11::string::operator=(in_RDI + 0x280,"hyperpricing");
  std::__cxx11::string::operator=
            (in_RDI + 0x600,"mode for hyper sparse pricing (0 - off, 1 - auto, 2 - always)");
  *(undefined4 *)(in_RDI + 0x7c0) = 0;
  *(undefined4 *)(in_RDI + 0x830) = 2;
  *(undefined4 *)(in_RDI + 0x750) = 1;
  std::__cxx11::string::operator=(in_RDI + 0x2a0,"ratfac_minstalls");
  std::__cxx11::string::operator=
            (in_RDI + 0x620,
             "minimum number of stalling refinements since last pivot to trigger rational factorization"
            );
  *(undefined4 *)(in_RDI + 0x7c4) = 0;
  *(undefined4 *)(in_RDI + 0x834) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x754) = 2;
  std::__cxx11::string::operator=(in_RDI + 0x2c0,"leastsq_maxrounds");
  std::__cxx11::string::operator=
            (in_RDI + 0x640,
             "maximum number of conjugate gradient iterations in least square scaling");
  *(undefined4 *)(in_RDI + 0x7c8) = 0;
  *(undefined4 *)(in_RDI + 0x838) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x758) = 0x32;
  std::__cxx11::string::operator=(in_RDI + 0x2e0,"solution_polishing");
  std::__cxx11::string::operator=
            (in_RDI + 0x660,
             "mode for solution polishing (0 - off, 1 - max basic slack, 2 - min basic slack)");
  *(undefined4 *)(in_RDI + 0x7cc) = 0;
  *(undefined4 *)(in_RDI + 0x83c) = 2;
  *(undefined4 *)(in_RDI + 0x75c) = 0;
  std::__cxx11::string::operator=(in_RDI + 0x300,"printbasismetric");
  std::__cxx11::string::operator=
            (in_RDI + 0x680,
             "print basis metric during the solve (-1 - off, 0 - condition estimate , 1 - trace, 2 - determinant, 3 - condition)"
            );
  *(undefined4 *)(in_RDI + 2000) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x840) = 3;
  *(undefined4 *)(in_RDI + 0x760) = 0xffffffff;
  std::__cxx11::string::operator=(in_RDI + 800,"stattimer");
  std::__cxx11::string::operator=
            (in_RDI + 0x6a0,
             "measure for statistics, e.g. factorization time (0 - off, 1 - user time, 2 - wallclock time)"
            );
  *(undefined4 *)(in_RDI + 0x7d4) = 0;
  *(undefined4 *)(in_RDI + 0x844) = 2;
  *(undefined4 *)(in_RDI + 0x764) = 1;
  std::__cxx11::string::operator=(in_RDI + 0x340,"multiprecision_limit");
  std::__cxx11::string::operator=
            (in_RDI + 0x6c0,"maximum number of digits for the multiprecision type");
  *(undefined4 *)(in_RDI + 0x7d8) = 0x32;
  *(undefined4 *)(in_RDI + 0x848) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x768) = 300;
  std::__cxx11::string::operator=(in_RDI + 0x360,"storeBasisSimplexFreq");
  std::__cxx11::string::operator=
            (in_RDI + 0x6e0,
             "at max, after how many simplex pivots do we store the advanced and stable basis, 1 = every iterations"
            );
  *(undefined4 *)(in_RDI + 0x7dc) = 1;
  *(undefined4 *)(in_RDI + 0x84c) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x76c) = 10000;
  return;
}

Assistant:

SoPlexBase<R>::Settings::IntParam::IntParam()
{
   // objective sense
   name[SoPlexBase<R>::OBJSENSE] = "objsense";
   description[SoPlexBase<R>::OBJSENSE] = "objective sense (-1 - minimize, +1 - maximize)";
   lower[SoPlexBase<R>::OBJSENSE] = -1;
   upper[SoPlexBase<R>::OBJSENSE] = 1;
   defaultValue[SoPlexBase<R>::OBJSENSE] = SoPlexBase<R>::OBJSENSE_MAXIMIZE;

   // type of computational form, i.e., column or row representation
   name[SoPlexBase<R>::REPRESENTATION] = "representation";
   description[SoPlexBase<R>::REPRESENTATION] =
      "type of computational form (0 - auto, 1 - column representation, 2 - row representation)";
   lower[SoPlexBase<R>::REPRESENTATION] = 0;
   upper[SoPlexBase<R>::REPRESENTATION] = 2;
   defaultValue[SoPlexBase<R>::REPRESENTATION] = SoPlexBase<R>::REPRESENTATION_AUTO;

   // type of algorithm, i.e., primal or dual
   name[SoPlexBase<R>::ALGORITHM] = "algorithm";
   description[SoPlexBase<R>::ALGORITHM] = "type of algorithm (0 - primal, 1 - dual)";
   lower[SoPlexBase<R>::ALGORITHM] = 0;
   upper[SoPlexBase<R>::ALGORITHM] = 1;
   defaultValue[SoPlexBase<R>::ALGORITHM] = SoPlexBase<R>::ALGORITHM_DUAL;

   // type of LU update
   name[SoPlexBase<R>::FACTOR_UPDATE_TYPE] = "factor_update_type";
   description[SoPlexBase<R>::FACTOR_UPDATE_TYPE] =
      "type of LU update (0 - eta update, 1 - Forrest-Tomlin update)";
   lower[SoPlexBase<R>::FACTOR_UPDATE_TYPE] = 0;
   upper[SoPlexBase<R>::FACTOR_UPDATE_TYPE] = 1;
   defaultValue[SoPlexBase<R>::FACTOR_UPDATE_TYPE] = SoPlexBase<R>::FACTOR_UPDATE_TYPE_FT;

   // maximum number of updates without fresh factorization
   name[SoPlexBase<R>::FACTOR_UPDATE_MAX] = "factor_update_max";
   description[SoPlexBase<R>::FACTOR_UPDATE_MAX] =
      "maximum number of LU updates without fresh factorization (0 - auto)";
   lower[SoPlexBase<R>::FACTOR_UPDATE_MAX] = 0;
   upper[SoPlexBase<R>::FACTOR_UPDATE_MAX] = INT_MAX;
   defaultValue[SoPlexBase<R>::FACTOR_UPDATE_MAX] = 0;

   // iteration limit (-1 if unlimited)
   name[SoPlexBase<R>::ITERLIMIT] = "iterlimit";
   description[SoPlexBase<R>::ITERLIMIT] = "iteration limit (-1 - no limit)";
   lower[SoPlexBase<R>::ITERLIMIT] = -1;
   upper[SoPlexBase<R>::ITERLIMIT] = INT_MAX;
   defaultValue[SoPlexBase<R>::ITERLIMIT] = -1;

   // refinement limit (-1 if unlimited)
   name[SoPlexBase<R>::REFLIMIT] = "reflimit";
   description[SoPlexBase<R>::REFLIMIT] = "refinement limit (-1 - no limit)";
   lower[SoPlexBase<R>::REFLIMIT] = -1;
   upper[SoPlexBase<R>::REFLIMIT] = INT_MAX;
   defaultValue[SoPlexBase<R>::REFLIMIT] = -1;

   // stalling refinement limit (-1 if unlimited)
   name[SoPlexBase<R>::STALLREFLIMIT] = "stallreflimit";
   description[SoPlexBase<R>::STALLREFLIMIT] = "stalling refinement limit (-1 - no limit)";
   lower[SoPlexBase<R>::STALLREFLIMIT] = -1;
   upper[SoPlexBase<R>::STALLREFLIMIT] = INT_MAX;
   defaultValue[SoPlexBase<R>::STALLREFLIMIT] = -1;

   // display frequency
   name[SoPlexBase<R>::DISPLAYFREQ] = "displayfreq";
   description[SoPlexBase<R>::DISPLAYFREQ] = "display frequency";
   lower[SoPlexBase<R>::DISPLAYFREQ] = 1;
   upper[SoPlexBase<R>::DISPLAYFREQ] = INT_MAX;
   defaultValue[SoPlexBase<R>::DISPLAYFREQ] = 200;

   // verbosity level
   name[SoPlexBase<R>::VERBOSITY] = "verbosity";
   description[SoPlexBase<R>::VERBOSITY] =
      "verbosity level (0 - error, 1 - warning, 2 - debug, 3 - normal, 4 - high, 5 - full)";
   lower[SoPlexBase<R>::VERBOSITY] = 0;
   upper[SoPlexBase<R>::VERBOSITY] = 5;
   defaultValue[SoPlexBase<R>::VERBOSITY] = SoPlexBase<R>::VERBOSITY_NORMAL;
   //_intParamDefault[SoPlexBase<R>::VERBOSITY] = SoPlexBase<R>::VERBOSITY_FULL;

   // type of simplifier
   name[SoPlexBase<R>::SIMPLIFIER] = "simplifier";
   description[SoPlexBase<R>::SIMPLIFIER] = "simplifier (0 - off, 1 - auto, 2 - PaPILO, 3 - internal)";
   lower[SoPlexBase<R>::SIMPLIFIER] = 0;
   upper[SoPlexBase<R>::SIMPLIFIER] = 3;
   defaultValue[SoPlexBase<R>::SIMPLIFIER] = SoPlexBase<R>::SIMPLIFIER_INTERNAL;

   // type of scaler
   name[SoPlexBase<R>::SCALER] = "scaler";
   description[SoPlexBase<R>::SCALER] =
      "scaling (0 - off, 1 - uni-equilibrium, 2 - bi-equilibrium, 3 - geometric, 4 - iterated geometric, 5 - least squares, 6 - geometric-equilibrium)";
   lower[SoPlexBase<R>::SCALER] = 0;
   upper[SoPlexBase<R>::SCALER] = 6;
   defaultValue[SoPlexBase<R>::SCALER] = SoPlexBase<R>::SCALER_BIEQUI;

   // type of starter used to create crash basis
   name[SoPlexBase<R>::STARTER] = "starter";
   description[SoPlexBase<R>::STARTER] =
      "crash basis generated when starting from scratch (0 - none, 1 - weight, 2 - sum, 3 - vector)";
   lower[SoPlexBase<R>::STARTER] = 0;
   upper[SoPlexBase<R>::STARTER] = 3;
   defaultValue[SoPlexBase<R>::STARTER] = SoPlexBase<R>::STARTER_OFF;

   // type of pricer
   name[SoPlexBase<R>::PRICER] = "pricer";
   description[SoPlexBase<R>::PRICER] =
      "pricing method (0 - auto, 1 - dantzig, 2 - parmult, 3 - devex, 4 - quicksteep, 5 - steep)";
   lower[SoPlexBase<R>::PRICER] = 0;
   upper[SoPlexBase<R>::PRICER] = 5;
   defaultValue[SoPlexBase<R>::PRICER] = SoPlexBase<R>::PRICER_AUTO;

   // type of ratio test
   name[SoPlexBase<R>::RATIOTESTER] = "ratiotester";
   description[SoPlexBase<R>::RATIOTESTER] =
      "method for ratio test (0 - textbook, 1 - harris, 2 - fast, 3 - boundflipping)";
   lower[SoPlexBase<R>::RATIOTESTER] = 0;
   upper[SoPlexBase<R>::RATIOTESTER] = 3;
   defaultValue[SoPlexBase<R>::RATIOTESTER] = SoPlexBase<R>::RATIOTESTER_BOUNDFLIPPING;

   // mode for synchronizing real and rational LP
   name[SoPlexBase<R>::SYNCMODE] = "syncmode";
   description[SoPlexBase<R>::SYNCMODE] =
      "mode for synchronizing real and rational LP (0 - store only real LP, 1 - auto, 2 - manual)";
   lower[SoPlexBase<R>::SYNCMODE] = 0;
   upper[SoPlexBase<R>::SYNCMODE] = 2;
   defaultValue[SoPlexBase<R>::SYNCMODE] = SoPlexBase<R>::SYNCMODE_ONLYREAL;

   // mode for reading LP files
   name[SoPlexBase<R>::READMODE] = "readmode";
   description[SoPlexBase<R>::READMODE] =
      "mode for reading LP files (0 - floating-point, 1 - rational)";
   lower[SoPlexBase<R>::READMODE] = 0;
   upper[SoPlexBase<R>::READMODE] = 1;
   defaultValue[SoPlexBase<R>::READMODE] = SoPlexBase<R>::READMODE_REAL;

   // mode for iterative refinement strategy
   name[SoPlexBase<R>::SOLVEMODE] = "solvemode";
   description[SoPlexBase<R>::SOLVEMODE] =
      "mode for iterative refinement strategy (0 - floating-point solve, 1 - auto, 2 - exact rational solve)";
   lower[SoPlexBase<R>::SOLVEMODE] = 0;
   upper[SoPlexBase<R>::SOLVEMODE] = 2;
   defaultValue[SoPlexBase<R>::SOLVEMODE] = SoPlexBase<R>::SOLVEMODE_AUTO;

   // mode for iterative refinement strategy
   name[SoPlexBase<R>::CHECKMODE] = "checkmode";
   description[SoPlexBase<R>::CHECKMODE] =
      "mode for a posteriori feasibility checks (0 - floating-point check, 1 - auto, 2 - exact rational check)";
   lower[SoPlexBase<R>::CHECKMODE] = 0;
   upper[SoPlexBase<R>::CHECKMODE] = 2;
   defaultValue[SoPlexBase<R>::CHECKMODE] = SoPlexBase<R>::CHECKMODE_AUTO;

   // type of timing
   name[SoPlexBase<R>::TIMER] = "timer";
   description[SoPlexBase<R>::TIMER] =
      "type of timer (1 - cputime, aka. usertime, 2 - wallclock time, 0 - no timing)";
   lower[SoPlexBase<R>::TIMER] = 0;
   upper[SoPlexBase<R>::TIMER] = 2;
   defaultValue[SoPlexBase<R>::TIMER] = SoPlexBase<R>::TIMER_CPU;

   // mode for hyper sparse pricing
   name[SoPlexBase<R>::HYPER_PRICING] = "hyperpricing";
   description[SoPlexBase<R>::HYPER_PRICING] =
      "mode for hyper sparse pricing (0 - off, 1 - auto, 2 - always)";
   lower[SoPlexBase<R>::HYPER_PRICING] = 0;
   upper[SoPlexBase<R>::HYPER_PRICING] = 2;
   defaultValue[SoPlexBase<R>::HYPER_PRICING] = SoPlexBase<R>::HYPER_PRICING_AUTO;

   // minimum number of stalling refinements since last pivot to trigger rational factorization
   name[SoPlexBase<R>::RATFAC_MINSTALLS] = "ratfac_minstalls";
   description[SoPlexBase<R>::RATFAC_MINSTALLS] =
      "minimum number of stalling refinements since last pivot to trigger rational factorization";
   lower[SoPlexBase<R>::RATFAC_MINSTALLS] = 0;
   upper[SoPlexBase<R>::RATFAC_MINSTALLS] = INT_MAX;
   defaultValue[SoPlexBase<R>::RATFAC_MINSTALLS] = 2;

   // maximum number of conjugate gradient iterations in least square scaling
   name[SoPlexBase<R>::LEASTSQ_MAXROUNDS] = "leastsq_maxrounds";
   description[SoPlexBase<R>::LEASTSQ_MAXROUNDS] =
      "maximum number of conjugate gradient iterations in least square scaling";
   lower[SoPlexBase<R>::LEASTSQ_MAXROUNDS] = 0;
   upper[SoPlexBase<R>::LEASTSQ_MAXROUNDS] = INT_MAX;
   defaultValue[SoPlexBase<R>::LEASTSQ_MAXROUNDS] = 50;

   // mode for solution polishing
   name[SoPlexBase<R>::SOLUTION_POLISHING] = "solution_polishing";
   description[SoPlexBase<R>::SOLUTION_POLISHING] =
      "mode for solution polishing (0 - off, 1 - max basic slack, 2 - min basic slack)";
   lower[SoPlexBase<R>::SOLUTION_POLISHING] = 0;
   upper[SoPlexBase<R>::SOLUTION_POLISHING] = 2;
   defaultValue[SoPlexBase<R>::SOLUTION_POLISHING] = SoPlexBase<R>::POLISHING_OFF;

   // printing condition number during the solve
   name[SoPlexBase<R>::PRINTBASISMETRIC] = "printbasismetric";
   description[SoPlexBase<R>::PRINTBASISMETRIC] =
      "print basis metric during the solve (-1 - off, 0 - condition estimate , 1 - trace, 2 - determinant, 3 - condition)";
   lower[SoPlexBase<R>::PRINTBASISMETRIC] = -1;
   upper[SoPlexBase<R>::PRINTBASISMETRIC] = 3;
   defaultValue[SoPlexBase<R>::PRINTBASISMETRIC] = -1;

   /// measure time spent in solving steps, e.g. factorization time
   name[SoPlexBase<R>::STATTIMER] = "stattimer";
   description[SoPlexBase<R>::STATTIMER] =
      "measure for statistics, e.g. factorization time (0 - off, 1 - user time, 2 - wallclock time)";
   lower[SoPlexBase<R>::STATTIMER] = 0;
   upper[SoPlexBase<R>::STATTIMER] = 2;
   defaultValue[SoPlexBase<R>::STATTIMER] = 1;

   // maximum number of digits for the multiprecision type
   name[SoPlexBase<R>::MULTIPRECISION_LIMIT] = "multiprecision_limit";
   description[SoPlexBase<R>::MULTIPRECISION_LIMIT] =
      "maximum number of digits for the multiprecision type";
   lower[SoPlexBase<R>::MULTIPRECISION_LIMIT] = 50;
   upper[SoPlexBase<R>::MULTIPRECISION_LIMIT] = INT_MAX;
   defaultValue[SoPlexBase<R>::MULTIPRECISION_LIMIT] = 300;
   // if precision is too high, double tolerances are rounded to zero
   // 300 is very close to the greatest int k such that (double)1e-k != 0

   // at max, after how many simplex pivots do we store the advanced and stable basis, 1 = every iterations
   name[SoPlexBase<R>::STORE_BASIS_SIMPLEX_FREQ] = "storeBasisSimplexFreq";
   description[SoPlexBase<R>::STORE_BASIS_SIMPLEX_FREQ] =
      "at max, after how many simplex pivots do we store the advanced and stable basis, 1 = every iterations";
   lower[SoPlexBase<R>::STORE_BASIS_SIMPLEX_FREQ] = 1;
   upper[SoPlexBase<R>::STORE_BASIS_SIMPLEX_FREQ] = INT_MAX;
   defaultValue[SoPlexBase<R>::STORE_BASIS_SIMPLEX_FREQ] = 10000;
}